

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

int __thiscall
basist::basisu_transcoder::find_slice
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t image_index,
          uint32_t level_index,bool alpha_data)

{
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  packed_uint *this_00;
  uint32_t in_ECX;
  long in_RSI;
  uint32_t in_R8D;
  byte in_R9B;
  bool slice_alpha;
  basis_slice_desc *slice_desc;
  uint32_t slice_iter;
  basis_slice_desc *pSlice_descs;
  uint8_t *pDataU8;
  basis_file_header *pHeader;
  packed_uint<4U> *in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffbc;
  uint uVar4;
  uint uVar5;
  void *in_stack_ffffffffffffffc0;
  basisu_transcoder *in_stack_ffffffffffffffc8;
  int local_4;
  
  bVar1 = validate_header_quick
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if (bVar1) {
    uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffffb0);
    lVar3 = in_RSI + (ulong)uVar2;
    uVar4 = 0;
    while (uVar5 = uVar4,
          uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 0xe)),
          uVar4 < uVar2) {
      this_00 = (packed_uint *)(lVar3 + (ulong)uVar5 * 0x17);
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int(this_00);
      if ((uVar2 == in_ECX) &&
         (uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int(this_00 + 3), uVar2 == in_R8D))
      {
        uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 0x14));
        if (uVar2 != 0) {
          return uVar5;
        }
        uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int(this_00 + 4);
        if (((uVar2 & 1) != 0) == (bool)(in_R9B & 1)) {
          return uVar5;
        }
      }
      uVar4 = uVar5 + 1;
    }
    local_4 = -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int basisu_transcoder::find_slice(const void* pData, uint32_t data_size, uint32_t image_index, uint32_t level_index, bool alpha_data) const
	{
		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::find_slice: header validation failed\n");
			return false;
		}

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);
		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);
		const basis_slice_desc* pSlice_descs = reinterpret_cast<const basis_slice_desc*>(pDataU8 + pHeader->m_slice_desc_file_ofs);

		// For very large basis files this search could be painful
		// TODO: Binary search this
		for (uint32_t slice_iter = 0; slice_iter < pHeader->m_total_slices; slice_iter++)
		{
			const basis_slice_desc& slice_desc = pSlice_descs[slice_iter];
			if ((slice_desc.m_image_index == image_index) && (slice_desc.m_level_index == level_index))
			{
				if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
				{
					const bool slice_alpha = (slice_desc.m_flags & cSliceDescFlagsHasAlpha) != 0;
					if (slice_alpha == alpha_data)
						return slice_iter;
				}
				else
				{
					return slice_iter;
				}
			}
		}

		BASISU_DEVEL_ERROR("basisu_transcoder::find_slice: didn't find slice\n");

		return -1;
	}